

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> * __thiscall
dgrminer::PartialUnion::createAdjacencyLists
          (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           *__return_storage_ptr__,PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          int snapshots)

{
  int *piVar1;
  vector<int,std::allocator<int>> *pvVar2;
  vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *pvVar3;
  _Rb_tree_header *p_Var4;
  int iVar5;
  _Rb_tree_color _Var6;
  iterator iVar7;
  iterator iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pvVar12;
  pointer paVar13;
  pointer paVar14;
  undefined4 in_register_0000000c;
  ulong uVar15;
  int *__args;
  array<int,_8UL> *__args_00;
  ulong uVar16;
  long lVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  _Base_ptr p_Var25;
  int id_counter;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  *adjacency_lists;
  AdjacencyListCrate alc;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adjacencyListNodes;
  vector<int,_std::allocator<int>_> numbers_of_nodes;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacencyMoreInfo;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacencyList;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> new_node_ids;
  int local_13c;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *local_138;
  ulong local_130;
  value_type local_128;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> local_d8;
  void *local_b8;
  iterator iStack_b0;
  int *local_a8;
  ulong local_a0;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_98;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_90;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_130 = CONCAT44(in_register_0000000c,snapshots);
  p_Var4 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_13c = 0;
  local_a8 = (int *)0x0;
  local_b8 = (void *)0x0;
  iStack_b0._M_current = (int *)0x0;
  paVar13 = (this->nodes).
            super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  uVar15 = ((long)(this->nodes).
                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3) *
           -0x5555555555555555;
  iVar24 = 1;
  uVar16 = 0;
  uVar22 = 0;
  local_138 = __return_storage_ptr__;
  local_98 = newedges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  do {
    uVar23 = uVar22;
    if ((uVar16 == uVar15) || (iVar24 < paVar13[uVar16]._M_elems[0])) {
      if (iStack_b0._M_current == local_a8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,&local_13c);
      }
      else {
        *iStack_b0._M_current = local_13c;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      paVar14 = (this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)(this->edges).
                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 5;
      if (uVar22 < uVar15) {
        do {
          uVar23 = uVar22;
          if (iVar24 < paVar14[uVar22]._M_elems[0]) break;
          p_Var20 = &p_Var4->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
            paVar14[uVar22]._M_elems[1] = local_60._M_impl.super__Rb_tree_header._M_node_count._4_4_
            ;
          }
          else {
            iVar5 = paVar14[uVar22]._M_elems[1];
            p_Var19 = &p_Var4->_M_header;
            p_Var25 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              p_Var21 = p_Var25;
              p_Var18 = p_Var19;
              _Var6 = p_Var21[1]._M_color;
              p_Var19 = p_Var21;
              if ((int)_Var6 < iVar5) {
                p_Var19 = p_Var18;
              }
              p_Var25 = (&p_Var21->_M_left)[(int)_Var6 < iVar5];
            } while ((&p_Var21->_M_left)[(int)_Var6 < iVar5] != (_Base_ptr)0x0);
            p_Var25 = &p_Var4->_M_header;
            if ((_Rb_tree_header *)p_Var19 != p_Var4) {
              if ((int)_Var6 < iVar5) {
                p_Var21 = p_Var18;
              }
              p_Var25 = p_Var19;
              if (iVar5 < (int)p_Var21[1]._M_color) {
                p_Var25 = &p_Var4->_M_header;
              }
            }
            paVar14[uVar22]._M_elems[1] = *(int *)&p_Var25[1].field_0x4;
            iVar5 = paVar14[uVar22]._M_elems[2];
            p_Var19 = &p_Var4->_M_header;
            p_Var25 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              p_Var21 = p_Var25;
              p_Var18 = p_Var19;
              _Var6 = p_Var21[1]._M_color;
              p_Var19 = p_Var21;
              if ((int)_Var6 < iVar5) {
                p_Var19 = p_Var18;
              }
              p_Var25 = (&p_Var21->_M_left)[(int)_Var6 < iVar5];
            } while ((&p_Var21->_M_left)[(int)_Var6 < iVar5] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var19 != p_Var4) {
              if ((int)_Var6 < iVar5) {
                p_Var21 = p_Var18;
              }
              p_Var20 = p_Var19;
              if (iVar5 < (int)p_Var21[1]._M_color) {
                p_Var20 = &p_Var4->_M_header;
              }
            }
          }
          paVar14[uVar22]._M_elems[2] = *(int *)&p_Var20[1].field_0x4;
          uVar22 = uVar22 + 1;
          uVar23 = uVar15;
        } while (uVar22 != uVar15);
      }
      if (uVar16 == ((long)(this->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
      break;
      iVar24 = iVar24 + 1;
      local_13c = 0;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&local_60);
      paVar13 = (this->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    local_128.adjacencyList.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_13c,paVar13[uVar16]._M_elems[1]);
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::_M_emplace_unique<std::pair<int,int>>
              ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                *)&local_60,(pair<int,_int> *)&local_128);
    paVar13 = (this->nodes).
              super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    paVar13[uVar16]._M_elems[1] = local_13c;
    local_13c = local_13c + 1;
    uVar16 = uVar16 + 1;
    uVar15 = ((long)(this->nodes).
                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3) *
             -0x5555555555555555;
    uVar22 = uVar23;
  } while (uVar16 <= uVar15);
  (local_138->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_138->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_138->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)local_130) {
    local_130 = (ulong)((int)local_130 + 1);
    uVar16 = 1;
    uVar15 = 0;
    uVar22 = 0;
    do {
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_78,(long)*(int *)((long)local_b8 + uVar16 * 4 + -4),(value_type *)&local_128,
               (allocator_type *)&local_90);
      if (local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.adjacencyList.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::vector(&local_90,(long)*(int *)((long)local_b8 + uVar16 * 4 + -4),(value_type *)&local_128,
               (allocator_type *)&local_d8);
      if (local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.adjacencyList.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (array<int,_3UL> *)0x0;
      local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (array<int,_3UL> *)0x0;
      paVar13 = (this->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (uVar15 < (ulong)(((long)(this->nodes).
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3) *
                          -0x5555555555555555)) {
        lVar17 = uVar15 * 0x18 + 0x10;
        do {
          if ((long)uVar16 < (long)*(int *)((long)paVar13->_M_elems + lVar17 + -0x10)) break;
          local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(*(undefined4 *)((long)paVar13->_M_elems + lVar17),
                                 *(undefined4 *)((long)paVar13->_M_elems + lVar17 + -0xc));
          iVar24 = *(int *)((long)paVar13->_M_elems + lVar17 + -8);
          local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_128.adjacencyList.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar24);
          if (local_d8.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_d8.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>::
            _M_realloc_insert<std::array<int,3ul>const&>
                      ((vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>> *)&local_d8,
                       (iterator)
                       local_d8.
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(array<int,_3UL> *)&local_128);
          }
          else {
            (local_d8.
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->_M_elems[2] = iVar24;
            *(pointer *)
             (local_d8.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_d8.
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_d8.
                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar15 = uVar15 + 1;
          paVar13 = (this->nodes).
                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x18;
        } while (uVar15 < (ulong)(((long)(this->nodes).
                                         super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13
                                  >> 3) * -0x5555555555555555));
      }
      paVar14 = (this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_a0 = uVar16;
      if (uVar22 < (ulong)((long)(this->edges).
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 5)) {
        uVar16 = uVar22 << 5 | 4;
        do {
          if ((long)local_a0 < (long)*(int *)((long)paVar14->_M_elems + (uVar16 - 4))) break;
          piVar1 = (int *)((long)paVar14->_M_elems + uVar16);
          __args = piVar1 + 1;
          pvVar2 = (vector<int,std::allocator<int>> *)
                   (local_78.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *piVar1);
          iVar7._M_current = *(int **)(pvVar2 + 8);
          if (iVar7._M_current == *(int **)(pvVar2 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar2,iVar7,__args)
            ;
            paVar14 = (this->edges).
                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar24 = *(int *)((long)paVar14->_M_elems + uVar16 + 4);
          }
          else {
            iVar24 = *__args;
            *iVar7._M_current = iVar24;
            *(int **)(pvVar2 + 8) = iVar7._M_current + 1;
          }
          pvVar2 = (vector<int,std::allocator<int>> *)
                   (local_78.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar24);
          piVar1 = (int *)((long)paVar14->_M_elems + uVar16);
          iVar7._M_current = *(int **)(pvVar2 + 8);
          if (iVar7._M_current == *(int **)(pvVar2 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar2,iVar7,piVar1)
            ;
            paVar14 = (this->edges).
                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *iVar7._M_current = *piVar1;
            *(int **)(pvVar2 + 8) = iVar7._M_current + 1;
          }
          pvVar3 = (vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
                   (local_90.
                    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)((long)paVar14->_M_elems + uVar16));
          paVar14 = (local_98->
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          __args_00 = (array<int,_8UL> *)((long)paVar14->_M_elems + (uVar16 - 4));
          iVar8._M_current = *(array<int,_8UL> **)(pvVar3 + 8);
          if (iVar8._M_current == *(array<int,_8UL> **)(pvVar3 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>const&>(pvVar3,iVar8,__args_00);
          }
          else {
            uVar9 = *(undefined8 *)__args_00->_M_elems;
            uVar10 = *(undefined8 *)((long)paVar14->_M_elems + uVar16 + 4);
            uVar11 = *(undefined8 *)((long)paVar14->_M_elems + uVar16 + 0x14);
            *(undefined8 *)((iVar8._M_current)->_M_elems + 4) =
                 *(undefined8 *)((long)paVar14->_M_elems + uVar16 + 0xc);
            *(undefined8 *)((iVar8._M_current)->_M_elems + 6) = uVar11;
            *(undefined8 *)(iVar8._M_current)->_M_elems = uVar9;
            *(undefined8 *)((iVar8._M_current)->_M_elems + 2) = uVar10;
            *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 0x20;
          }
          pvVar12 = local_90.
                    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar24 = *(int *)((long)((this->edges).
                                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar16 + 4
                           );
          flipAdjacencyInfo((array<int,_8UL> *)
                            ((long)((local_98->
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                            (uVar16 - 4)));
          pvVar3 = (vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
                   (pvVar12 + iVar24);
          iVar8._M_current = *(array<int,_8UL> **)(pvVar3 + 8);
          if (iVar8._M_current == *(array<int,_8UL> **)(pvVar3 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>>(pvVar3,iVar8,(array<int,_8UL> *)&local_128);
          }
          else {
            *(pointer *)((iVar8._M_current)->_M_elems + 4) =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(pointer *)((iVar8._M_current)->_M_elems + 6) =
                 local_128.adjacencyEdgeInfo.
                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)(iVar8._M_current)->_M_elems =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)((iVar8._M_current)->_M_elems + 2) =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 0x20;
          }
          uVar22 = uVar22 + 1;
          paVar14 = (this->edges).
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = uVar16 + 0x20;
        } while (uVar22 < (ulong)((long)(this->edges).
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar14
                                 >> 5));
      }
      local_128.nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyEdgeInfo.
      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyEdgeInfo.
      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.adjacencyEdgeInfo.
      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&local_128.adjacencyList,&local_78);
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::operator=(&local_128.adjacencyEdgeInfo,&local_90);
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
                (&local_128.nodes,&local_d8);
      std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
      push_back(local_138,&local_128);
      if (local_128.nodes.
          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.nodes.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&local_128.adjacencyEdgeInfo);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_128.adjacencyList);
      if (local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&local_90);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_78);
      uVar16 = local_a0 + 1;
    } while (uVar16 != local_130);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return local_138;
}

Assistant:

std::vector<AdjacencyListCrate> PartialUnion::createAdjacencyLists(std::vector<std::array<int, 8>> & newedges, int snapshots)
	{
		// RENAME IDS (so IDS are from 0 to N)
		int current_snapshot = 1;  // because first time stamp == 1
		std::map<int, int> new_node_ids;
		int id_counter = 0;

		vector<int> numbers_of_nodes; // how many nodes there are in each snapshot


		size_t edges_processed_index = 0;
		for (size_t i = 0; i <= nodes.size(); i++)
		{

			if (i == nodes.size() || nodes[i][PN_TIME] > current_snapshot)
			{
				// doing next snapshot
				numbers_of_nodes.push_back(id_counter);

				// rename edges
				for (; edges_processed_index < edges.size() && edges[edges_processed_index][PE_TIME] <= current_snapshot; edges_processed_index++)
				{
					edges[edges_processed_index][PE_SRC] = new_node_ids.find(edges[edges_processed_index][PE_SRC])->second;
					edges[edges_processed_index][PE_DST] = new_node_ids.find(edges[edges_processed_index][PE_DST])->second;
				}

				// after all elements are processed, end
				if (i == nodes.size()) break;
				// reset counters:

				current_snapshot++;

				id_counter = 0;
				new_node_ids.clear();

			}

			new_node_ids.insert(std::make_pair(nodes[i][PN_ID], id_counter));

			// rename node ids:
			nodes[i][PN_ID] = id_counter;

			id_counter++;
		}

		// BUILD ADJACENCY LISTS:
		std::vector<AdjacencyListCrate> adjacency_lists;
		current_snapshot = 1;
		size_t e_index = 0;
		size_t n_index = 0;
		for (int current_snapshot = 1; current_snapshot <= snapshots; current_snapshot++)
		{
			// for each snapshot
			// initialize vectors of appropriate sizes:
			std::vector<std::vector<int>> adjacencyList(numbers_of_nodes[current_snapshot - 1], std::vector<int>(0));
			std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacencyMoreInfo(
				numbers_of_nodes[current_snapshot - 1],
				std::vector<std::array<int, ADJ_INFO___SIZE>>(0)
			);
			std::vector<std::array<int, ADJ_NODES___SIZE>> adjacencyListNodes; // NEW

			while (n_index < nodes.size() && nodes[n_index][PN_TIME] <= current_snapshot)
			{
				// fill all nodes in the current snapshot:
				std::array<int, ADJ_NODES___SIZE> node = { nodes[n_index][PN_ID], nodes[n_index][PN_CHANGETIME], nodes[n_index][PN_LABEL] };
				adjacencyListNodes.push_back(node);
				n_index++;
			}
			while (e_index < edges.size() && edges[e_index][PE_TIME] <= current_snapshot)
			{
				// fill all edges of the current snapshot:
				adjacencyList[edges[e_index][PE_SRC]].push_back(edges[e_index][PE_DST]);
				adjacencyList[edges[e_index][PE_DST]].push_back(edges[e_index][PE_SRC]);
				adjacencyMoreInfo[edges[e_index][PE_SRC]].push_back(newedges[e_index]);
				adjacencyMoreInfo[edges[e_index][PE_DST]].push_back(flipAdjacencyInfo(newedges[e_index]));
				e_index++;
			}
			// create new struct element
			AdjacencyListCrate alc;
			alc.adjacencyList = adjacencyList;
			alc.adjacencyEdgeInfo = adjacencyMoreInfo;
			alc.nodes = adjacencyListNodes;
			adjacency_lists.push_back(alc);
		}


		return adjacency_lists;
	}